

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void __thiscall embree::Device::setDeviceErrorCode(Device *this,RTCError error,string *msg)

{
  int iVar1;
  RTCErrorMessage *pRVar2;
  
  pRVar2 = State::ErrorHandler::error(&(this->super_State).errorHandler);
  if (pRVar2->error == RTC_ERROR_NONE) {
    pRVar2->error = error;
    iVar1 = std::__cxx11::string::compare((char *)msg);
    if (iVar1 != 0) {
      std::__cxx11::string::_M_assign((string *)&pRVar2->msg);
      return;
    }
  }
  return;
}

Assistant:

void Device::setDeviceErrorCode(RTCError error, std::string const& msg)
  {
    RTCErrorMessage* stored_error = errorHandler.error();
    if (stored_error->error == RTC_ERROR_NONE) {
      stored_error->error = error;
      if (msg != "")
        stored_error->msg = msg;
    }
  }